

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

void CChat::Com_Whisper(IResult *pResult,void *pContext)

{
  CChat *this;
  CGameClient *this_00;
  int iVar1;
  undefined4 extraout_var;
  
  this = *(CChat **)((long)pContext + 0x18);
  this_00 = (this->super_CComponent).m_pClient;
  if (this_00->m_pConfig->m_ClDisableWhisper != 0) {
    ClearInput(this);
    return;
  }
  iVar1 = (*pResult->_vptr_IResult[4])(pResult,0);
  iVar1 = CGameClient::GetClientID(this_00,(char *)CONCAT44(extraout_var,iVar1));
  if (iVar1 != -1) {
    this->m_WhisperTarget = iVar1;
    EnableMode(this,3,(char *)0x0);
    return;
  }
  return;
}

Assistant:

void CChat::Com_Whisper(IConsole::IResult *pResult, void *pContext)
{
	CCommandManager::SCommandContext *pCommandContext = (CCommandManager::SCommandContext *)pContext;
	CChat *pChatData = (CChat *)pCommandContext->m_pContext;

	if(pChatData->Config()->m_ClDisableWhisper)
	{
		pChatData->ClearInput();
		return;
	}

	int TargetID = pChatData->m_pClient->GetClientID(pResult->GetString(0));
	if(TargetID != -1)
	{
		pChatData->m_WhisperTarget = TargetID;
		pChatData->EnableMode(CHAT_WHISPER);
	}
}